

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_date_time_zone_id *
mg_date_time_zone_id_copy_ca(mg_date_time_zone_id *src,mg_allocator *allocator)

{
  mg_allocator *in_RSI;
  int64_t *in_RDI;
  mg_date_time_zone_id *date_time_zone_id;
  mg_date_time_zone_id *local_8;
  
  if (in_RDI == (int64_t *)0x0) {
    local_8 = (mg_date_time_zone_id *)0x0;
  }
  else {
    local_8 = mg_date_time_zone_id_alloc(in_RSI);
    if (local_8 == (mg_date_time_zone_id *)0x0) {
      local_8 = (mg_date_time_zone_id *)0x0;
    }
    else {
      local_8->seconds = *in_RDI;
      local_8->nanoseconds = in_RDI[1];
      local_8->tz_id = in_RDI[2];
    }
  }
  return local_8;
}

Assistant:

mg_date_time_zone_id *mg_date_time_zone_id_copy_ca(
    const mg_date_time_zone_id *src, mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_date_time_zone_id *date_time_zone_id =
      mg_date_time_zone_id_alloc(allocator);
  if (!date_time_zone_id) {
    return NULL;
  }
  memcpy(date_time_zone_id, src, sizeof(mg_date_time_zone_id));
  return date_time_zone_id;
}